

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O2

void return_pocklestatus(strbuf *out,PockleStatus status)

{
  char *pcVar1;
  
  switch(status) {
  case POCKLE_OK:
    pcVar1 = "POCKLE_OK";
    break;
  case POCKLE_SMALL_PRIME_NOT_SMALL:
    pcVar1 = "POCKLE_SMALL_PRIME_NOT_SMALL";
    break;
  case POCKLE_SMALL_PRIME_NOT_PRIME:
    pcVar1 = "POCKLE_SMALL_PRIME_NOT_PRIME";
    break;
  case POCKLE_PRIME_SMALLER_THAN_2:
    pcVar1 = "POCKLE_PRIME_SMALLER_THAN_2";
    break;
  case POCKLE_FACTOR_NOT_KNOWN_PRIME:
    pcVar1 = "POCKLE_FACTOR_NOT_KNOWN_PRIME";
    break;
  case POCKLE_FACTOR_NOT_A_FACTOR:
    pcVar1 = "POCKLE_FACTOR_NOT_A_FACTOR";
    break;
  case POCKLE_PRODUCT_OF_FACTORS_TOO_SMALL:
    pcVar1 = "POCKLE_PRODUCT_OF_FACTORS_TOO_SMALL";
    break;
  case POCKLE_FERMAT_TEST_FAILED:
    pcVar1 = "POCKLE_FERMAT_TEST_FAILED";
    break;
  case POCKLE_DISCRIMINANT_IS_SQUARE:
    pcVar1 = "POCKLE_DISCRIMINANT_IS_SQUARE";
    break;
  case POCKLE_WITNESS_POWER_IS_1:
    pcVar1 = "POCKLE_WITNESS_POWER_IS_1";
    break;
  case POCKLE_WITNESS_POWER_NOT_COPRIME:
    pcVar1 = "POCKLE_WITNESS_POWER_NOT_COPRIME";
    break;
  default:
    BinarySink_put_fmt(out->binarysink_,"POCKLE_BAD_STATUS_VALUE\n");
    return;
  }
  BinarySink_put_fmt(out->binarysink_,"%s\n",pcVar1);
  return;
}

Assistant:

static void return_pocklestatus(strbuf *out, PockleStatus status)
{
    switch (status) {
      default:
        put_fmt(out, "POCKLE_BAD_STATUS_VALUE\n");
        break;

#define STATUS_CASE(id)                         \
      case id:                                  \
        put_fmt(out, "%s\n", #id);          \
        break;

        POCKLE_STATUSES(STATUS_CASE);

#undef STATUS_CASE

    }
}